

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

void __thiscall
QFormLayoutPrivate::setLayout(QFormLayoutPrivate *this,int row,ItemRole role,QLayout *layout)

{
  bool bVar1;
  
  if (layout != (QLayout *)0x0) {
    bVar1 = QLayout::adoptLayout(*(QLayout **)&(this->super_QLayoutPrivate).field_0x8,layout);
    if (bVar1) {
      setItem(this,row,role,&layout->super_QLayoutItem);
      return;
    }
  }
  return;
}

Assistant:

void QFormLayoutPrivate::setLayout(int row, QFormLayout::ItemRole role, QLayout *layout)
{
    if (layout) {
        Q_Q(QFormLayout);
        if (q->adoptLayout(layout))
            setItem(row, role, layout);
    }
}